

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O2

void __thiscall
slang::parsing::ParserBase::skipToken(ParserBase *this,optional<slang::DiagCode> diagCode)

{
  long lVar1;
  bool bVar2;
  TokenKind TVar3;
  size_type sVar4;
  Token *args;
  SourceRange range;
  TokenKind skipKind;
  SmallVector<slang::parsing::TokenKind,_20UL> delimStack;
  undefined1 local_82 [2];
  Token local_80;
  SmallVectorBase<slang::parsing::TokenKind> local_70 [2];
  
  local_80 = peek(this);
  args = &local_80;
  bVar2 = haveDiagAtCurrentLoc(this);
  SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
            (&(this->skippedTokens).super_SmallVectorBase<slang::parsing::Token>,args);
  Window::moveToNext(&this->window);
  if (((uint6)diagCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
              super__Optional_payload_base<slang::DiagCode> & 0x100000000) != 0 && !bVar2) {
    range = Token::range(&local_80);
    args = (Token *)((ulong)(uint6)diagCode.super__Optional_base<slang::DiagCode,_true,_true>.
                                   _M_payload.super__Optional_payload_base<slang::DiagCode> &
                    0xffffffff);
    addDiag(this,diagCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::DiagCode>._M_payload._M_value,range);
  }
  local_82 = (undefined1  [2])slang::syntax::SyntaxFacts::getSkipToKind(local_80.kind);
  if (local_82 != (undefined1  [2])0x0) {
    local_70[0].data_ = (pointer)local_70[0].firstElement;
    local_70[0].len = 0;
    local_70[0].cap = 0x14;
    while( true ) {
      local_80 = peek(this);
      if (local_80.kind == EndOfFile) break;
      bVar2 = slang::syntax::SyntaxFacts::isEndKeyword(local_80.kind);
      if (bVar2) {
        while( true ) {
          args = (Token *)(ulong)(ushort)local_82;
          sVar4 = local_70[0].len - 1;
          if ((undefined1  [2])local_80.kind == local_82) break;
          if (sVar4 == 0xffffffffffffffff) goto LAB_001e969f;
          local_82 = *(undefined1 (*) [2])((long)local_70[0].data_ + sVar4 * 2);
          local_70[0].len = sVar4;
        }
      }
      args = &local_80;
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                (&(this->skippedTokens).super_SmallVectorBase<slang::parsing::Token>,&local_80);
      Window::moveToNext(&this->window);
      if ((undefined1  [2])local_80.kind == local_82) {
        if (local_70[0].len == 0) break;
        lVar1 = local_70[0].len - 1;
        local_70[0].len = local_70[0].len - 1;
        local_82 = (undefined1  [2])*(TokenKind *)((long)local_70[0].data_ + lVar1 * 2);
      }
      else {
        TVar3 = slang::syntax::SyntaxFacts::getSkipToKind(local_80.kind);
        if (TVar3 != Unknown) {
          args = (Token *)local_82;
          SmallVectorBase<slang::parsing::TokenKind>::emplace_back<slang::parsing::TokenKind_const&>
                    (local_70,(TokenKind *)local_82);
          local_82 = (undefined1  [2])TVar3;
        }
      }
    }
LAB_001e969f:
    SmallVectorBase<slang::parsing::TokenKind>::cleanup(local_70,(EVP_PKEY_CTX *)args);
  }
  return;
}

Assistant:

void ParserBase::skipToken(std::optional<DiagCode> diagCode) {
    auto token = peek();
    SLANG_ASSERT(token.kind != TokenKind::EndOfFile);

    bool haveDiag = haveDiagAtCurrentLoc();
    skippedTokens.push_back(token);
    window.moveToNext();

    if (diagCode && !haveDiag)
        addDiag(*diagCode, token.range());

    // If the token we're skipping is an opening paren / bracket / brace,
    // skip everything up to the corresponding closing token, otherwise we're
    // pretty much guaranteed to report a bunch of spurious errors inside it.
    TokenKind skipKind = SF::getSkipToKind(token.kind);
    if (skipKind == TokenKind::Unknown)
        return;

    SmallVector<TokenKind> delimStack;
    while (true) {
        token = peek();
        if (token.kind == TokenKind::EndOfFile)
            return;

        // If this is an end keyword but not the one we're looking for,
        // it probably matches something higher in our stack so don't
        // necessarily consume it.
        if (SF::isEndKeyword(token.kind)) {
            while (token.kind != skipKind) {
                if (delimStack.empty())
                    return;

                skipKind = delimStack.back();
                delimStack.pop_back();
            }
        }

        skippedTokens.push_back(token);
        window.moveToNext();

        if (token.kind == skipKind) {
            if (delimStack.empty())
                return;

            skipKind = delimStack.back();
            delimStack.pop_back();
        }
        else {
            TokenKind newSkipKind = SF::getSkipToKind(token.kind);
            if (newSkipKind != TokenKind::Unknown) {
                delimStack.push_back(skipKind);
                skipKind = newSkipKind;
            }
        }
    }
}